

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

ALLEGRO_PATH * al_clone_path(ALLEGRO_PATH *path)

{
  ALLEGRO_PATH *pAVar1;
  undefined8 *puVar2;
  ALLEGRO_USTR *pAVar3;
  ulong uVar4;
  
  uVar4 = 0;
  pAVar1 = al_create_path((char *)0x0);
  if (pAVar1 != (ALLEGRO_PATH *)0x0) {
    al_ustr_assign(pAVar1->drive,path->drive);
    al_ustr_assign(pAVar1->filename,path->filename);
    for (; uVar4 < (path->segments)._size; uVar4 = (ulong)((uint)uVar4 + 1)) {
      puVar2 = (undefined8 *)_al_vector_alloc_back(&pAVar1->segments);
      pAVar3 = get_segment(path,(uint)uVar4);
      pAVar3 = al_ustr_dup(pAVar3);
      *puVar2 = pAVar3;
    }
  }
  return pAVar1;
}

Assistant:

ALLEGRO_PATH *al_clone_path(const ALLEGRO_PATH *path)
{
   ALLEGRO_PATH *clone;
   unsigned int i;

   ASSERT(path);

   clone = al_create_path(NULL);
   if (!clone) {
      return NULL;
   }

   al_ustr_assign(clone->drive, path->drive);
   al_ustr_assign(clone->filename, path->filename);

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      ALLEGRO_USTR **slot = _al_vector_alloc_back(&clone->segments);
      (*slot) = al_ustr_dup(get_segment(path, i));
   }

   return clone;
}